

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool gzip::is_compressed(char *data,size_t size)

{
  char cVar1;
  
  if (2 < size) {
    if (*data == '\x1f') {
      return data[1] == -0x75;
    }
    if (*data == 'x') {
      cVar1 = data[1];
      if (cVar1 == '\x01') {
        return true;
      }
      if (cVar1 == '^') {
        return true;
      }
      if (cVar1 == -100) {
        return true;
      }
      if (cVar1 == -0x26) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline bool is_compressed(const char *data, std::size_t size) {
        return size > 2 &&
               (
                       // zlib
                       (
                               static_cast<uint8_t>(data[0]) == 0x78 &&
                               (static_cast<uint8_t>(data[1]) == 0x9C ||
                                static_cast<uint8_t>(data[1]) == 0x01 ||
                                static_cast<uint8_t>(data[1]) == 0xDA ||
                                static_cast<uint8_t>(data[1]) == 0x5E)) ||
                       // gzip
                       (static_cast<uint8_t>(data[0]) == 0x1F && static_cast<uint8_t>(data[1]) == 0x8B));
    }